

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::createAffixMatchers
          (AffixMatcherWarehouse *this,AffixPatternProvider *patternInfo,
          MutableMatcherCollection *output,IgnorablesMatcher *ignorables,parse_flags_t parseFlags,
          UErrorCode *status)

{
  AffixPatternMatcher **ppAVar1;
  AffixPatternMatcher *pAVar2;
  bool bVar3;
  bool bVar4;
  AffixPatternMatcher *pAVar5;
  int32_t i;
  uint uVar6;
  AffixPatternMatcher *this_00;
  int iVar7;
  long lVar8;
  AffixPatternMatcher *pAVar9;
  uint uVar10;
  ulong uVar11;
  AffixPatternMatcher *pAVar12;
  int8_t iVar13;
  AffixMatcherWarehouse *pAVar14;
  AffixMatcher *rhs;
  ulong uVar15;
  long lStackY_140;
  bool hasSuffix;
  bool hasPrefix;
  AffixPatternMatcher *local_120;
  parse_flags_t local_118;
  int local_114;
  AffixPatternMatcher *local_110;
  AffixMatcherWarehouse *local_108;
  UNumberSignDisplay local_100;
  uint local_fc;
  AffixPatternMatcher *local_f8;
  ulong local_f0;
  AffixPatternMatcher *local_e8;
  AffixPatternProvider *local_e0;
  AffixMatcher temp;
  UnicodeString sb;
  
  local_e0 = patternInfo;
  bVar3 = isInteresting(patternInfo,ignorables,parseFlags,status);
  if (bVar3) {
    sb.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003edbf0;
    sb.fUnion.fStackFields.fLengthAndFlags = 2;
    local_100 = (uint)parseFlags >> 10 & UNUM_SIGN_ALWAYS;
    local_e8 = this->fAffixPatternMatchers;
    iVar13 = '\x01';
    local_120 = (AffixPatternMatcher *)0x0;
    local_110 = (AffixPatternMatcher *)0x0;
    local_114 = 0;
    uVar11 = 0;
    local_118 = parseFlags;
    local_108 = this;
    while( true ) {
      lVar8 = (long)(int)uVar11;
      if (iVar13 < -1) break;
      hasPrefix = false;
      local_f0 = uVar11;
      icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
                (local_e0,true,iVar13,local_100,OTHER,false,&sb);
      AffixPatternMatcher::fromAffixPattern
                ((AffixPatternMatcher *)&temp,&sb,local_108->fTokenWarehouse,parseFlags,&hasPrefix,
                 status);
      pAVar9 = local_e8 + local_114;
      AffixPatternMatcher::operator=(pAVar9,(AffixPatternMatcher *)&temp);
      AffixPatternMatcher::~AffixPatternMatcher((AffixPatternMatcher *)&temp);
      bVar3 = hasPrefix;
      if (hasPrefix == false) {
        pAVar9 = (AffixPatternMatcher *)0x0;
      }
      hasSuffix = false;
      icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
                (local_e0,false,iVar13,local_100,OTHER,false,&sb);
      AffixPatternMatcher::fromAffixPattern
                ((AffixPatternMatcher *)&temp,&sb,local_108->fTokenWarehouse,local_118,&hasSuffix,
                 status);
      local_114 = local_114 + (uint)bVar3;
      this_00 = local_e8 + local_114;
      AffixPatternMatcher::operator=(this_00,(AffixPatternMatcher *)&temp);
      AffixPatternMatcher::~AffixPatternMatcher((AffixPatternMatcher *)&temp);
      pAVar2 = local_110;
      local_fc = (uint)hasSuffix;
      if (local_fc == 0) {
        this_00 = (AffixPatternMatcher *)0x0;
      }
      pAVar5 = this_00;
      pAVar12 = pAVar9;
      if (((iVar13 == '\x01') ||
          (bVar4 = anon_unknown.dwarf_1ff060::equals(pAVar9,local_110), pAVar5 = local_120,
          pAVar12 = pAVar2, !bVar4)) ||
         (bVar4 = anon_unknown.dwarf_1ff060::equals(this_00,local_120), pAVar5 = local_120, !bVar4))
      {
        bVar4 = (char)local_118 < '\0';
        temp.super_NumberParseMatcher._vptr_NumberParseMatcher =
             (_func_int **)&PTR__NumberParseMatcher_003e1e68;
        uVar10 = (uint)(iVar13 == -1);
        local_120 = (AffixPatternMatcher *)CONCAT44(local_120._4_4_,(int)local_f0 + 1);
        local_108->fAffixMatchers[lVar8].fFlags = uVar10;
        ppAVar1 = &local_108->fAffixMatchers[lVar8].fPrefix;
        *ppAVar1 = pAVar9;
        ppAVar1[1] = this_00;
        local_110 = pAVar5;
        local_f8 = pAVar12;
        temp.fPrefix = pAVar9;
        temp.fSuffix = this_00;
        temp.fFlags = uVar10;
        NumberParseMatcher::~NumberParseMatcher(&temp.super_NumberParseMatcher);
        parseFlags = local_118;
        if ((bVar4 & bVar3 & (byte)local_fc) == 1) {
          if ((iVar13 == '\x01') ||
             (bVar3 = anon_unknown.dwarf_1ff060::equals(pAVar9,local_f8), !bVar3)) {
            temp.super_NumberParseMatcher._vptr_NumberParseMatcher =
                 (_func_int **)&PTR__NumberParseMatcher_003e1e68;
            temp.fSuffix = (AffixPatternMatcher *)0x0;
            iVar7 = (int)local_f0;
            local_108->fAffixMatchers[(int)(uint)local_120].fFlags = uVar10;
            ppAVar1 = &local_108->fAffixMatchers[(int)(uint)local_120].fPrefix;
            *ppAVar1 = pAVar9;
            ppAVar1[1] = (AffixPatternMatcher *)0x0;
            temp.fPrefix = pAVar9;
            temp.fFlags = uVar10;
            NumberParseMatcher::~NumberParseMatcher(&temp.super_NumberParseMatcher);
            local_120 = (AffixPatternMatcher *)CONCAT44(local_120._4_4_,iVar7 + 2);
            if (iVar13 != '\x01') goto LAB_002812fe;
          }
          else {
LAB_002812fe:
            bVar3 = anon_unknown.dwarf_1ff060::equals(this_00,local_110);
            if (bVar3) goto LAB_00281323;
          }
          temp.super_NumberParseMatcher._vptr_NumberParseMatcher =
               (_func_int **)&PTR__NumberParseMatcher_003e1e68;
          temp.fPrefix = (AffixPatternMatcher *)0x0;
          uVar6 = (uint)local_120 + 1;
          local_108->fAffixMatchers[(int)(uint)local_120].fFlags = uVar10;
          ppAVar1 = &local_108->fAffixMatchers[(int)(uint)local_120].fPrefix;
          *ppAVar1 = (AffixPatternMatcher *)0x0;
          ppAVar1[1] = this_00;
          temp.fSuffix = this_00;
          temp.fFlags = uVar10;
          NumberParseMatcher::~NumberParseMatcher(&temp.super_NumberParseMatcher);
          pAVar9 = local_110;
          local_110 = local_f8;
        }
        else {
LAB_00281323:
          pAVar9 = local_110;
          local_110 = local_f8;
          uVar6 = (uint)local_120;
        }
      }
      else {
        pAVar9 = local_120;
        uVar6 = (uint)local_f0;
        parseFlags = local_118;
      }
      local_114 = local_114 + local_fc;
      iVar13 = iVar13 + -1;
      uVar11 = (ulong)uVar6;
      local_120 = pAVar9;
    }
    lStackY_140 = 1;
    bVar3 = false;
    do {
      for (; bVar4 = bVar3, pAVar14 = local_108, lStackY_140 < lVar8; lStackY_140 = lStackY_140 + 1)
      {
        rhs = local_108->fAffixMatchers + lStackY_140;
        iVar13 = AffixMatcher::compareTo(local_108->fAffixMatchers + lStackY_140 + -1,rhs);
        if ('\0' < iVar13) {
          temp.super_NumberParseMatcher._vptr_NumberParseMatcher =
               (_func_int **)&PTR__NumberParseMatcher_003e1e68;
          temp.fFlags = pAVar14->fAffixMatchers[lStackY_140 + -1].fFlags;
          temp.fPrefix = pAVar14->fAffixMatchers[lStackY_140 + -1].fPrefix;
          temp.fSuffix = pAVar14->fAffixMatchers[lStackY_140 + -1].fSuffix;
          pAVar14->fAffixMatchers[lStackY_140 + -1].fFlags = rhs->fFlags;
          pAVar9 = rhs->fSuffix;
          pAVar14->fAffixMatchers[lStackY_140 + -1].fPrefix = rhs->fPrefix;
          pAVar14->fAffixMatchers[lStackY_140 + -1].fSuffix = pAVar9;
          rhs->fFlags = temp.fFlags;
          rhs->fPrefix = temp.fPrefix;
          rhs->fSuffix = temp.fSuffix;
          NumberParseMatcher::~NumberParseMatcher(&temp.super_NumberParseMatcher);
          bVar4 = true;
        }
        bVar3 = bVar4;
      }
      lStackY_140 = 1;
      bVar3 = false;
    } while (bVar4);
    uVar15 = 0;
    if (0 < (int)uVar11) {
      uVar15 = uVar11;
    }
    while (uVar15 != 0) {
      (*output->_vptr_MutableMatcherCollection[2])(output,pAVar14);
      pAVar14 = (AffixMatcherWarehouse *)(pAVar14->fAffixMatchers + 1);
      uVar15 = uVar15 - 1;
    }
    UnicodeString::~UnicodeString(&sb);
  }
  return;
}

Assistant:

void AffixMatcherWarehouse::createAffixMatchers(const AffixPatternProvider& patternInfo,
                                                MutableMatcherCollection& output,
                                                const IgnorablesMatcher& ignorables,
                                                parse_flags_t parseFlags, UErrorCode& status) {
    if (!isInteresting(patternInfo, ignorables, parseFlags, status)) {
        return;
    }

    // The affixes have interesting characters, or we are in strict mode.
    // Use initial capacity of 6, the highest possible number of AffixMatchers.
    UnicodeString sb;
    bool includeUnpaired = 0 != (parseFlags & PARSE_FLAG_INCLUDE_UNPAIRED_AFFIXES);
    UNumberSignDisplay signDisplay = (0 != (parseFlags & PARSE_FLAG_PLUS_SIGN_ALLOWED)) ? UNUM_SIGN_ALWAYS
                                                                                        : UNUM_SIGN_AUTO;

    int32_t numAffixMatchers = 0;
    int32_t numAffixPatternMatchers = 0;

    AffixPatternMatcher* posPrefix = nullptr;
    AffixPatternMatcher* posSuffix = nullptr;

    // Pre-process the affix strings to resolve LDML rules like sign display.
    for (int8_t signum = 1; signum >= -1; signum--) {
        // Generate Prefix
        bool hasPrefix = false;
        PatternStringUtils::patternInfoToStringBuilder(
                patternInfo, true, signum, signDisplay, StandardPlural::OTHER, false, sb);
        fAffixPatternMatchers[numAffixPatternMatchers] = AffixPatternMatcher::fromAffixPattern(
                sb, *fTokenWarehouse, parseFlags, &hasPrefix, status);
        AffixPatternMatcher* prefix = hasPrefix ? &fAffixPatternMatchers[numAffixPatternMatchers++]
                                                : nullptr;

        // Generate Suffix
        bool hasSuffix = false;
        PatternStringUtils::patternInfoToStringBuilder(
                patternInfo, false, signum, signDisplay, StandardPlural::OTHER, false, sb);
        fAffixPatternMatchers[numAffixPatternMatchers] = AffixPatternMatcher::fromAffixPattern(
                sb, *fTokenWarehouse, parseFlags, &hasSuffix, status);
        AffixPatternMatcher* suffix = hasSuffix ? &fAffixPatternMatchers[numAffixPatternMatchers++]
                                                : nullptr;

        if (signum == 1) {
            posPrefix = prefix;
            posSuffix = suffix;
        } else if (equals(prefix, posPrefix) && equals(suffix, posSuffix)) {
            // Skip adding these matchers (we already have equivalents)
            continue;
        }

        // Flags for setting in the ParsedNumber; the token matchers may add more.
        int flags = (signum == -1) ? FLAG_NEGATIVE : 0;

        // Note: it is indeed possible for posPrefix and posSuffix to both be null.
        // We still need to add that matcher for strict mode to work.
        fAffixMatchers[numAffixMatchers++] = {prefix, suffix, flags};
        if (includeUnpaired && prefix != nullptr && suffix != nullptr) {
            // The following if statements are designed to prevent adding two identical matchers.
            if (signum == 1 || !equals(prefix, posPrefix)) {
                fAffixMatchers[numAffixMatchers++] = {prefix, nullptr, flags};
            }
            if (signum == 1 || !equals(suffix, posSuffix)) {
                fAffixMatchers[numAffixMatchers++] = {nullptr, suffix, flags};
            }
        }
    }

    // Put the AffixMatchers in order, and then add them to the output.
    // Since there are at most 9 elements, do a simple-to-implement bubble sort.
    bool madeChanges;
    do {
        madeChanges = false;
        for (int32_t i = 1; i < numAffixMatchers; i++) {
            if (fAffixMatchers[i - 1].compareTo(fAffixMatchers[i]) > 0) {
                madeChanges = true;
                AffixMatcher temp = std::move(fAffixMatchers[i - 1]);
                fAffixMatchers[i - 1] = std::move(fAffixMatchers[i]);
                fAffixMatchers[i] = std::move(temp);
            }
        }
    } while (madeChanges);

    for (int32_t i = 0; i < numAffixMatchers; i++) {
        // Enable the following line to debug affixes
        //std::cout << "Adding affix matcher: " << CStr(fAffixMatchers[i].toString())() << std::endl;
        output.addMatcher(fAffixMatchers[i]);
    }
}